

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int ddSymmSiftingBackward(DdManager *table,Move *moves,int size)

{
  uint y;
  uint uVar1;
  DdSubtable *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Move *pMVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint *puVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  
  for (pMVar6 = moves; pMVar6 != (Move *)0x0; pMVar6 = pMVar6->next) {
    if (pMVar6->size < size) {
      size = pMVar6->size;
    }
  }
  while( true ) {
    iVar5 = 1;
    iVar3 = -1;
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) {
      return 1;
    }
    pDVar2 = table->subtables;
    uVar4 = moves->x;
    uVar12 = (ulong)uVar4;
    y = moves->y;
    uVar10 = (ulong)y;
    if ((pDVar2[uVar12].next == uVar4) && (pDVar2[uVar10].next == y)) {
      iVar3 = cuddSwapInPlace(table,uVar4,y);
    }
    else {
      uVar1 = pDVar2[(int)uVar4].next;
      uVar9 = uVar10;
      do {
        uVar7 = (uint)uVar9;
        uVar9 = (ulong)pDVar2[(int)uVar7].next;
      } while (uVar7 < pDVar2[(int)uVar7].next);
      iVar8 = uVar4 - uVar1;
      iVar15 = uVar7 - y;
      iVar16 = iVar8 + 1;
      if (iVar8 + 1 < 1) {
        iVar16 = 0;
      }
      iVar13 = -1;
      if (-1 < iVar15) {
        iVar13 = iVar15;
      }
      for (; iVar17 = iVar16, iVar5 != iVar13 + 2; iVar5 = iVar5 + 1) {
        while (iVar17 != 0) {
          iVar3 = cuddSwapInPlace(table,(int)uVar12,(int)uVar10);
          if (iVar3 == 0) {
            return 0;
          }
          uVar4 = cuddNextLow(table,(int)uVar12);
          uVar10 = uVar12;
          uVar12 = (ulong)uVar4;
          iVar17 = iVar17 + -1;
        }
        uVar10 = (ulong)(iVar5 + y);
        uVar12 = (ulong)((iVar5 + y) - 1);
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      pDVar2 = table->subtables;
      lVar18 = (long)(int)uVar1 << 0x20;
      puVar14 = &pDVar2[(int)uVar1].next;
      for (iVar5 = 1; iVar5 - iVar15 != 1; iVar5 = iVar5 + 1) {
        *puVar14 = uVar1 + iVar5;
        lVar18 = lVar18 + 0x100000000;
        puVar14 = puVar14 + 0xe;
      }
      pDVar2[lVar18 >> 0x20].next = uVar1;
      lVar18 = (long)(int)(uVar1 + 1 + iVar15);
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      lVar11 = lVar18 << 0x20;
      puVar14 = &pDVar2[lVar18].next;
      uVar4 = uVar1 + iVar15 + 2;
      while (bVar19 = iVar8 != 0, iVar8 = iVar8 + -1, bVar19) {
        *puVar14 = uVar4;
        lVar11 = lVar11 + 0x100000000;
        puVar14 = puVar14 + 0xe;
        uVar4 = uVar4 + 1;
      }
      pDVar2[lVar11 >> 0x20].next = uVar1 + iVar5;
    }
    if (iVar3 == 0) break;
    moves = moves->next;
  }
  return 0;
}

Assistant:

static int
ddSymmSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res = -1;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (table->subtables[move->x].next == move->x && table->subtables[move->y].next == move->y) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
#ifdef DD_DEBUG
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = ddSymmGroupMoveBackward(table,(int)move->x,(int)move->y);
        }
        if (!res) return(0);
    }

    return(1);

}